

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderClose(xmlTextReaderPtr reader)

{
  xmlParserCtxtPtr pxVar1;
  xmlDocPtr cur;
  int iVar2;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    iVar2 = -1;
  }
  else {
    reader->node = (xmlNodePtr)0x0;
    reader->curnode = (xmlNodePtr)0x0;
    reader->mode = 4;
    if (reader->faketext != (xmlNodePtr)0x0) {
      xmlFreeNode(reader->faketext);
      reader->faketext = (xmlNodePtr)0x0;
    }
    pxVar1 = reader->ctxt;
    if (pxVar1 != (xmlParserCtxtPtr)0x0) {
      if (((pxVar1->vctxt).vstateTab != (xmlValidState *)0x0) && (0 < (pxVar1->vctxt).vstateMax)) {
        while (pxVar1 = reader->ctxt, 0 < (pxVar1->vctxt).vstateNr) {
          xmlValidatePopElement(&pxVar1->vctxt,(xmlDocPtr)0x0,(xmlNodePtr)0x0,(xmlChar *)0x0);
        }
        (*xmlFree)((pxVar1->vctxt).vstateTab);
        pxVar1 = reader->ctxt;
        (pxVar1->vctxt).vstateTab = (xmlValidState *)0x0;
        (pxVar1->vctxt).vstateMax = 0;
      }
      xmlStopParser(reader->ctxt);
      cur = reader->ctxt->myDoc;
      if (cur != (xmlDocPtr)0x0) {
        if (reader->preserve == 0) {
          xmlTextReaderFreeDoc(reader,cur);
        }
        reader->ctxt->myDoc = (xmlDocPtr)0x0;
      }
    }
    iVar2 = 0;
    if ((reader->input != (xmlParserInputBufferPtr)0x0) && (iVar2 = 0, (reader->allocs & 1) != 0)) {
      xmlFreeParserInputBuffer(reader->input);
      reader->allocs = reader->allocs + -1;
    }
  }
  return iVar2;
}

Assistant:

int
xmlTextReaderClose(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    reader->node = NULL;
    reader->curnode = NULL;
    reader->mode = XML_TEXTREADER_MODE_CLOSED;
    if (reader->faketext != NULL) {
        xmlFreeNode(reader->faketext);
        reader->faketext = NULL;
    }
    if (reader->ctxt != NULL) {
#ifdef LIBXML_VALID_ENABLED
	if ((reader->ctxt->vctxt.vstateTab != NULL) &&
	    (reader->ctxt->vctxt.vstateMax > 0)){
#ifdef LIBXML_REGEXP_ENABLED
            while (reader->ctxt->vctxt.vstateNr > 0)
                xmlValidatePopElement(&reader->ctxt->vctxt, NULL, NULL, NULL);
#endif /* LIBXML_REGEXP_ENABLED */
	    xmlFree(reader->ctxt->vctxt.vstateTab);
	    reader->ctxt->vctxt.vstateTab = NULL;
	    reader->ctxt->vctxt.vstateMax = 0;
	}
#endif /* LIBXML_VALID_ENABLED */
	xmlStopParser(reader->ctxt);
	if (reader->ctxt->myDoc != NULL) {
	    if (reader->preserve == 0)
		xmlTextReaderFreeDoc(reader, reader->ctxt->myDoc);
	    reader->ctxt->myDoc = NULL;
	}
    }
    if ((reader->input != NULL)  && (reader->allocs & XML_TEXTREADER_INPUT)) {
	xmlFreeParserInputBuffer(reader->input);
	reader->allocs -= XML_TEXTREADER_INPUT;
    }
    return(0);
}